

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O3

Polygon * __thiscall nite::Polygon::operator-(Polygon *__return_storage_ptr__,Polygon *this,float c)

{
  pointer pVVar1;
  long lVar2;
  long lVar3;
  
  std::vector<nite::Vec2,_std::allocator<nite::Vec2>_>::vector
            (&__return_storage_ptr__->vert,&this->vert);
  (__return_storage_ptr__->origin).x = (this->origin).x;
  (__return_storage_ptr__->origin).y = (this->origin).y;
  pVVar1 = (__return_storage_ptr__->vert).
           super__Vector_base<nite::Vec2,_std::allocator<nite::Vec2>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar2 = (long)(__return_storage_ptr__->vert).
                super__Vector_base<nite::Vec2,_std::allocator<nite::Vec2>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pVVar1;
  if (lVar2 != 0) {
    lVar2 = lVar2 >> 3;
    lVar3 = 0;
    do {
      pVVar1[lVar3].x = pVVar1[lVar3].x - c;
      pVVar1[lVar3].y = pVVar1[lVar3].y - c;
      lVar3 = lVar3 + 1;
    } while (lVar2 + (ulong)(lVar2 == 0) != lVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

nite::Polygon nite::Polygon::operator-(float c){
	auto sub = *this;
	for(int i = 0; i < sub.vert.size(); ++i){
		sub.vert[i].x -= c;
		sub.vert[i].y -= c;
	}
	return sub;
}